

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined4 uVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar60;
  uint uVar61;
  uint uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_25ec;
  int local_25c4;
  ulong local_25c0;
  ulong *local_25b8;
  RayQueryContext *local_25b0;
  long local_25a8;
  long local_25a0;
  Geometry *local_2598;
  Scene *local_2590;
  RTCFilterFunctionNArguments local_2588;
  float local_2558;
  undefined4 local_2554;
  undefined4 local_2550;
  undefined4 local_254c;
  undefined4 local_2548;
  undefined4 local_2544;
  uint local_2540;
  uint local_253c;
  uint local_2538;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  byte local_24c7;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25b8 = local_2368;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar38 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar27._8_4_ = 0x7fffffff;
    auVar27._0_8_ = 0x7fffffff7fffffff;
    auVar27._12_4_ = 0x7fffffff;
    auVar27 = vandps_avx512vl((undefined1  [16])aVar2,auVar27);
    auVar58._8_4_ = 0x219392ef;
    auVar58._0_8_ = 0x219392ef219392ef;
    auVar58._12_4_ = 0x219392ef;
    uVar24 = vcmpps_avx512vl(auVar27,auVar58,1);
    bVar6 = (bool)((byte)uVar24 & 1);
    auVar28._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.x;
    bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar28._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.y;
    bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar28._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.z;
    bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar28._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * aVar2.field_3.a;
    auVar27 = vrcp14ps_avx512vl(auVar28);
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar29 = vfnmadd213ps_avx512vl(auVar28,auVar27,auVar29);
    local_2370[0] = 0;
    auVar28 = vfmadd132ps_fma(auVar29,auVar27,auVar27);
    auVar41 = vbroadcastss_avx512vl(auVar28);
    auVar66 = ZEXT3264(auVar41);
    auVar27 = vmovshdup_avx(auVar28);
    auVar41 = vbroadcastsd_avx512vl(auVar27);
    auVar67 = ZEXT3264(auVar41);
    auVar29 = vshufpd_avx(auVar28,auVar28,1);
    auVar45._8_4_ = 2;
    auVar45._0_8_ = 0x200000002;
    auVar45._12_4_ = 2;
    auVar45._16_4_ = 2;
    auVar45._20_4_ = 2;
    auVar45._24_4_ = 2;
    auVar45._28_4_ = 2;
    auVar41 = vpermps_avx512vl(auVar45,ZEXT1632(auVar28));
    auVar68 = ZEXT3264(auVar41);
    fVar49 = auVar28._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar47._4_4_ = fVar49;
    auVar47._0_4_ = fVar49;
    auVar47._8_4_ = fVar49;
    auVar47._12_4_ = fVar49;
    auVar47._16_4_ = fVar49;
    auVar47._20_4_ = fVar49;
    auVar47._24_4_ = fVar49;
    auVar47._28_4_ = fVar49;
    auVar41 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar69 = ZEXT3264(auVar41);
    auVar43 = ZEXT1632(CONCAT412(auVar28._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar28._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar28._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar49))
                                ));
    auVar42 = vpermps_avx512vl(auVar41,auVar43);
    auVar41 = vpermps_avx2(auVar45,auVar43);
    local_25c0 = (ulong)(auVar28._0_4_ < 0.0) << 5;
    uVar24 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
    uVar26 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
    uVar25 = local_25c0 ^ 0x20;
    uVar53 = auVar38._0_4_;
    auVar52 = ZEXT3264(CONCAT428(uVar53,CONCAT424(uVar53,CONCAT420(uVar53,CONCAT416(uVar53,CONCAT412
                                                  (uVar53,CONCAT48(uVar53,CONCAT44(uVar53,uVar53))))
                                                  ))));
    auVar44._8_4_ = 0x80000000;
    auVar44._0_8_ = 0x8000000080000000;
    auVar44._12_4_ = 0x80000000;
    auVar44._16_4_ = 0x80000000;
    auVar44._20_4_ = 0x80000000;
    auVar44._24_4_ = 0x80000000;
    auVar44._28_4_ = 0x80000000;
    auVar43 = vxorps_avx512vl(auVar47,auVar44);
    auVar70 = ZEXT3264(auVar43);
    auVar42 = vxorps_avx512vl(auVar42,auVar44);
    auVar71 = ZEXT3264(auVar42);
    auVar41 = vxorps_avx512vl(auVar41,auVar44);
    auVar72 = ZEXT3264(auVar41);
    auVar41 = vbroadcastss_avx512vl(auVar30);
    auVar73 = ZEXT3264(auVar41);
    auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar74 = ZEXT3264(auVar41);
    auVar41 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar75 = ZEXT3264(auVar41);
    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar76 = ZEXT1664(auVar30);
    auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar77 = ZEXT3264(auVar41);
    auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar78 = ZEXT3264(auVar41);
    local_25b0 = context;
    do {
      pfVar1 = (float *)(local_25b8 + -1);
      local_25b8 = local_25b8 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar22 = *local_25b8;
        while ((uVar22 & 8) == 0) {
          auVar41 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar22 + 0x40 + local_25c0),auVar70._0_32_,
                               auVar66._0_32_);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar24),auVar71._0_32_,
                               auVar67._0_32_);
          auVar41 = vpmaxsd_avx2(auVar41,auVar42);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar26),auVar72._0_32_,
                               auVar68._0_32_);
          auVar42 = vpmaxsd_avx512vl(auVar42,auVar73._0_32_);
          auVar41 = vpmaxsd_avx2(auVar41,auVar42);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar25),auVar70._0_32_,
                               auVar66._0_32_);
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar24 ^ 0x20)),
                               auVar71._0_32_,auVar67._0_32_);
          auVar42 = vpminsd_avx2(auVar42,auVar43);
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar26 ^ 0x20)),
                               auVar72._0_32_,auVar68._0_32_);
          auVar43 = vpminsd_avx2(auVar43,auVar52._0_32_);
          auVar42 = vpminsd_avx2(auVar42,auVar43);
          uVar21 = vpcmpd_avx512vl(auVar41,auVar42,2);
          bVar18 = (byte)uVar21;
          if (bVar18 == 0) goto LAB_01f17732;
          auVar42 = *(undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0);
          auVar43 = ((undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0))[1];
          auVar44 = vmovdqa64_avx512vl(auVar74._0_32_);
          auVar44 = vpternlogd_avx512vl(auVar44,auVar41,auVar75._0_32_,0xf8);
          auVar45 = vpcompressd_avx512vl(auVar44);
          auVar46._0_4_ =
               (uint)(bVar18 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar44._0_4_;
          bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
          auVar46._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
          bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
          auVar46._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
          bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
          auVar46._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
          bVar6 = (bool)((byte)(uVar21 >> 4) & 1);
          auVar46._16_4_ = (uint)bVar6 * auVar45._16_4_ | (uint)!bVar6 * auVar44._16_4_;
          bVar6 = (bool)((byte)(uVar21 >> 5) & 1);
          auVar46._20_4_ = (uint)bVar6 * auVar45._20_4_ | (uint)!bVar6 * auVar44._20_4_;
          bVar6 = (bool)((byte)(uVar21 >> 6) & 1);
          auVar46._24_4_ = (uint)bVar6 * auVar45._24_4_ | (uint)!bVar6 * auVar44._24_4_;
          bVar6 = SUB81(uVar21 >> 7,0);
          auVar46._28_4_ = (uint)bVar6 * auVar45._28_4_ | (uint)!bVar6 * auVar44._28_4_;
          auVar44 = vpermt2q_avx512vl(auVar42,auVar46,auVar43);
          uVar22 = auVar44._0_8_;
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 != 0) {
            auVar44 = vpshufd_avx2(auVar46,0x55);
            vpermt2q_avx512vl(auVar42,auVar44,auVar43);
            auVar45 = vpminsd_avx2(auVar46,auVar44);
            auVar44 = vpmaxsd_avx2(auVar46,auVar44);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 == 0) {
              auVar45 = vpermi2q_avx512vl(auVar45,auVar42,auVar43);
              uVar22 = auVar45._0_8_;
              auVar42 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
              *local_25b8 = auVar42._0_8_;
              auVar41 = vpermd_avx2(auVar44,auVar41);
              *(int *)(local_25b8 + 1) = auVar41._0_4_;
              local_25b8 = local_25b8 + 2;
            }
            else {
              auVar48 = vpshufd_avx2(auVar46,0xaa);
              vpermt2q_avx512vl(auVar42,auVar48,auVar43);
              auVar47 = vpminsd_avx2(auVar45,auVar48);
              auVar45 = vpmaxsd_avx2(auVar45,auVar48);
              auVar48 = vpminsd_avx2(auVar44,auVar45);
              auVar44 = vpmaxsd_avx2(auVar44,auVar45);
              bVar18 = bVar18 - 1 & bVar18;
              if (bVar18 == 0) {
                auVar45 = vpermi2q_avx512vl(auVar47,auVar42,auVar43);
                uVar22 = auVar45._0_8_;
                auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                *local_25b8 = auVar45._0_8_;
                auVar44 = vpermd_avx2(auVar44,auVar41);
                *(int *)(local_25b8 + 1) = auVar44._0_4_;
                auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                local_25b8[2] = auVar42._0_8_;
                auVar41 = vpermd_avx2(auVar48,auVar41);
                *(int *)(local_25b8 + 3) = auVar41._0_4_;
                local_25b8 = local_25b8 + 4;
              }
              else {
                auVar45 = vpshufd_avx2(auVar46,0xff);
                vpermt2q_avx512vl(auVar42,auVar45,auVar43);
                auVar7 = vpminsd_avx2(auVar47,auVar45);
                auVar45 = vpmaxsd_avx2(auVar47,auVar45);
                auVar47 = vpminsd_avx2(auVar48,auVar45);
                auVar45 = vpmaxsd_avx2(auVar48,auVar45);
                auVar48 = vpminsd_avx2(auVar44,auVar45);
                auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                bVar18 = bVar18 - 1 & bVar18;
                if (bVar18 == 0) {
                  auVar45 = vpermi2q_avx512vl(auVar7,auVar42,auVar43);
                  uVar22 = auVar45._0_8_;
                  auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                  *local_25b8 = auVar45._0_8_;
                  auVar44 = vpermd_avx2(auVar44,auVar41);
                  *(int *)(local_25b8 + 1) = auVar44._0_4_;
                  auVar44 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                  local_25b8[2] = auVar44._0_8_;
                  auVar44 = vpermd_avx2(auVar48,auVar41);
                  *(int *)(local_25b8 + 3) = auVar44._0_4_;
                  auVar42 = vpermt2q_avx512vl(auVar42,auVar47,auVar43);
                  local_25b8[4] = auVar42._0_8_;
                  auVar41 = vpermd_avx2(auVar47,auVar41);
                  *(int *)(local_25b8 + 5) = auVar41._0_4_;
                  local_25b8 = local_25b8 + 6;
                }
                else {
                  auVar46 = valignd_avx512vl(auVar46,auVar46,3);
                  auVar45 = vmovdqa64_avx512vl(auVar76._0_32_);
                  auVar45 = vpermt2d_avx512vl(auVar45,auVar77._0_32_,auVar7);
                  auVar45 = vpermt2d_avx512vl(auVar45,auVar78._0_32_,auVar47);
                  auVar47 = vpermt2d_avx512vl(auVar45,auVar78._0_32_,auVar48);
                  auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar44 = vpermt2d_avx512vl(auVar47,auVar45,auVar44);
                  auVar57 = ZEXT3264(auVar44);
                  bVar20 = bVar18;
                  do {
                    auVar45 = auVar57._0_32_;
                    auVar44 = vpermps_avx512vl(auVar69._0_32_,auVar46);
                    auVar46 = valignd_avx512vl(auVar46,auVar46,1);
                    vpermt2q_avx512vl(auVar42,auVar46,auVar43);
                    bVar20 = bVar20 - 1 & bVar20;
                    uVar11 = vpcmpd_avx512vl(auVar44,auVar45,5);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                    bVar12 = (byte)uVar11 << 1;
                    auVar45 = valignd_avx512vl(auVar45,auVar45,7);
                    bVar6 = (bool)((byte)uVar11 & 1);
                    auVar48._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                    auVar48._0_4_ = auVar44._0_4_;
                    bVar6 = (bool)(bVar12 >> 2 & 1);
                    auVar48._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                    bVar6 = (bool)(bVar12 >> 3 & 1);
                    auVar48._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                    bVar6 = (bool)(bVar12 >> 4 & 1);
                    auVar48._16_4_ = (uint)bVar6 * auVar45._16_4_ | (uint)!bVar6 * auVar44._16_4_;
                    bVar6 = (bool)(bVar12 >> 5 & 1);
                    auVar48._20_4_ = (uint)bVar6 * auVar45._20_4_ | (uint)!bVar6 * auVar44._20_4_;
                    bVar6 = (bool)(bVar12 >> 6 & 1);
                    auVar48._24_4_ = (uint)bVar6 * auVar45._24_4_ | (uint)!bVar6 * auVar44._24_4_;
                    auVar48._28_4_ =
                         (uint)(bVar12 >> 7) * auVar45._28_4_ |
                         (uint)!(bool)(bVar12 >> 7) * auVar44._28_4_;
                    auVar57 = ZEXT3264(auVar48);
                  } while (bVar20 != 0);
                  lVar19 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
                  do {
                    auVar44 = vpermi2q_avx512vl(auVar48,auVar42,auVar43);
                    *local_25b8 = auVar44._0_8_;
                    auVar45 = auVar57._0_32_;
                    auVar44 = vpermd_avx2(auVar45,auVar41);
                    *(int *)(local_25b8 + 1) = auVar44._0_4_;
                    auVar48 = valignd_avx512vl(auVar45,auVar45,1);
                    local_25b8 = local_25b8 + 2;
                    auVar57 = ZEXT3264(auVar48);
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                  auVar41 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                  uVar22 = auVar41._0_8_;
                }
              }
            }
          }
        }
        local_25a0 = (ulong)((uint)uVar22 & 0xf) - 8;
        if (local_25a0 != 0) {
          uVar22 = uVar22 & 0xfffffffffffffff0;
          local_25a8 = 0;
          do {
            lVar19 = local_25a8 * 0xb0;
            auVar30 = *(undefined1 (*) [16])(uVar22 + 0x80 + lVar19);
            auVar38 = *(undefined1 (*) [16])(uVar22 + 0x40 + lVar19);
            auVar27 = *(undefined1 (*) [16])(uVar22 + 0x70 + lVar19);
            auVar29 = *(undefined1 (*) [16])(uVar22 + 0x50 + lVar19);
            auVar31._0_4_ = auVar38._0_4_ * auVar30._0_4_;
            auVar31._4_4_ = auVar38._4_4_ * auVar30._4_4_;
            auVar31._8_4_ = auVar38._8_4_ * auVar30._8_4_;
            auVar31._12_4_ = auVar38._12_4_ * auVar30._12_4_;
            auVar28 = *(undefined1 (*) [16])(uVar22 + 0x60 + lVar19);
            auVar58 = *(undefined1 (*) [16])(uVar22 + 0x30 + lVar19);
            local_2488 = vfmsub231ps_fma(auVar31,auVar27,auVar29);
            auVar35._0_4_ = auVar29._0_4_ * auVar28._0_4_;
            auVar35._4_4_ = auVar29._4_4_ * auVar28._4_4_;
            auVar35._8_4_ = auVar29._8_4_ * auVar28._8_4_;
            auVar35._12_4_ = auVar29._12_4_ * auVar28._12_4_;
            local_2478 = vfmsub231ps_fma(auVar35,auVar30,auVar58);
            auVar36._0_4_ = auVar58._0_4_ * auVar27._0_4_;
            auVar36._4_4_ = auVar58._4_4_ * auVar27._4_4_;
            auVar36._8_4_ = auVar58._8_4_ * auVar27._8_4_;
            auVar36._12_4_ = auVar58._12_4_ * auVar27._12_4_;
            uVar53 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar63._4_4_ = uVar53;
            auVar63._0_4_ = uVar53;
            auVar63._8_4_ = uVar53;
            auVar63._12_4_ = uVar53;
            uVar53 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar64._4_4_ = uVar53;
            auVar64._0_4_ = uVar53;
            auVar64._8_4_ = uVar53;
            auVar64._12_4_ = uVar53;
            fVar49 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar37._4_4_ = fVar49;
            auVar37._0_4_ = fVar49;
            auVar37._8_4_ = fVar49;
            auVar37._12_4_ = fVar49;
            uVar53 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar34._4_4_ = uVar53;
            auVar34._0_4_ = uVar53;
            auVar34._8_4_ = uVar53;
            auVar34._12_4_ = uVar53;
            auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar22 + lVar19),auVar34);
            local_2468 = vfmsub231ps_fma(auVar36,auVar28,auVar38);
            uVar53 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar32._4_4_ = uVar53;
            auVar32._0_4_ = uVar53;
            auVar32._8_4_ = uVar53;
            auVar32._12_4_ = uVar53;
            auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar19),auVar32);
            uVar53 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar33._4_4_ = uVar53;
            auVar33._0_4_ = uVar53;
            auVar33._8_4_ = uVar53;
            auVar33._12_4_ = uVar53;
            auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar19),auVar33);
            auVar34 = vmulps_avx512vl(auVar64,auVar33);
            auVar35 = vfmsub231ps_avx512vl(auVar34,auVar32,auVar37);
            auVar34 = vmulps_avx512vl(auVar37,auVar31);
            auVar36 = vfmsub231ps_avx512vl(auVar34,auVar33,auVar63);
            auVar34 = vmulps_avx512vl(auVar63,auVar32);
            auVar37 = vfmsub231ps_avx512vl(auVar34,auVar31,auVar64);
            auVar65._0_4_ = fVar49 * local_2468._0_4_;
            auVar65._4_4_ = fVar49 * local_2468._4_4_;
            auVar65._8_4_ = fVar49 * local_2468._8_4_;
            auVar65._12_4_ = fVar49 * local_2468._12_4_;
            auVar34 = vfmadd231ps_fma(auVar65,local_2478,auVar64);
            auVar34 = vfmadd231ps_fma(auVar34,local_2488,auVar63);
            auVar13._8_4_ = 0x7fffffff;
            auVar13._0_8_ = 0x7fffffff7fffffff;
            auVar13._12_4_ = 0x7fffffff;
            local_24d8 = vandps_avx512vl(auVar34,auVar13);
            auVar30 = vmulps_avx512vl(auVar30,auVar37);
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar36,auVar27);
            auVar27 = vfmadd231ps_avx512vl(auVar30,auVar35,auVar28);
            auVar30._8_4_ = 0x80000000;
            auVar30._0_8_ = 0x8000000080000000;
            auVar30._12_4_ = 0x80000000;
            auVar30 = vandpd_avx512vl(auVar34,auVar30);
            uVar60 = auVar30._0_4_;
            local_2508._0_4_ = (float)(uVar60 ^ auVar27._0_4_);
            uVar23 = auVar30._4_4_;
            local_2508._4_4_ = (float)(uVar23 ^ auVar27._4_4_);
            uVar61 = auVar30._8_4_;
            local_2508._8_4_ = (float)(uVar61 ^ auVar27._8_4_);
            uVar62 = auVar30._12_4_;
            local_2508._12_4_ = (float)(uVar62 ^ auVar27._12_4_);
            auVar30 = vmulps_avx512vl(auVar29,auVar37);
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar38,auVar36);
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar58,auVar35);
            local_24f8._0_4_ = (float)(uVar60 ^ auVar30._0_4_);
            local_24f8._4_4_ = (float)(uVar23 ^ auVar30._4_4_);
            local_24f8._8_4_ = (float)(uVar61 ^ auVar30._8_4_);
            local_24f8._12_4_ = (float)(uVar62 ^ auVar30._12_4_);
            auVar30 = ZEXT816(0) << 0x20;
            uVar11 = vcmpps_avx512vl(local_2508,auVar30,5);
            uVar8 = vcmpps_avx512vl(local_24f8,auVar30,5);
            uVar9 = vcmpps_avx512vl(auVar34,auVar30,4);
            auVar38._0_4_ = local_2508._0_4_ + local_24f8._0_4_;
            auVar38._4_4_ = local_2508._4_4_ + local_24f8._4_4_;
            auVar38._8_4_ = local_2508._8_4_ + local_24f8._8_4_;
            auVar38._12_4_ = local_2508._12_4_ + local_24f8._12_4_;
            uVar10 = vcmpps_avx512vl(auVar38,local_24d8,2);
            local_24c7 = (byte)uVar11 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
            if (local_24c7 != 0) {
              auVar59._0_4_ = auVar33._0_4_ * local_2468._0_4_;
              auVar59._4_4_ = auVar33._4_4_ * local_2468._4_4_;
              auVar59._8_4_ = auVar33._8_4_ * local_2468._8_4_;
              auVar59._12_4_ = auVar33._12_4_ * local_2468._12_4_;
              auVar30 = vfmadd213ps_fma(auVar32,local_2478,auVar59);
              auVar30 = vfmadd213ps_fma(auVar31,local_2488,auVar30);
              local_24e8._0_4_ = (float)(uVar60 ^ auVar30._0_4_);
              local_24e8._4_4_ = (float)(uVar23 ^ auVar30._4_4_);
              local_24e8._8_4_ = (float)(uVar61 ^ auVar30._8_4_);
              local_24e8._12_4_ = (float)(uVar62 ^ auVar30._12_4_);
              uVar53 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar14._4_4_ = uVar53;
              auVar14._0_4_ = uVar53;
              auVar14._8_4_ = uVar53;
              auVar14._12_4_ = uVar53;
              auVar30 = vmulps_avx512vl(local_24d8,auVar14);
              fVar49 = (ray->super_RayK<1>).tfar;
              auVar15._4_4_ = fVar49;
              auVar15._0_4_ = fVar49;
              auVar15._8_4_ = fVar49;
              auVar15._12_4_ = fVar49;
              auVar38 = vmulps_avx512vl(local_24d8,auVar15);
              uVar11 = vcmpps_avx512vl(local_24e8,auVar38,2);
              uVar8 = vcmpps_avx512vl(auVar30,local_24e8,1);
              local_24c7 = (byte)uVar11 & (byte)uVar8 & local_24c7;
              if (local_24c7 != 0) {
                lVar19 = lVar19 + uVar22;
                auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                auVar3._4_4_ = (ray->super_RayK<1>).mask;
                auVar3._8_4_ = (ray->super_RayK<1>).id;
                auVar3._12_4_ = (ray->super_RayK<1>).flags;
                auVar57 = ZEXT1664(auVar3);
                local_25ec = (uint)local_24c7;
                uVar60 = vextractps_avx(auVar3,1);
                auVar30 = vrcp14ps_avx512vl(local_24d8);
                auVar16._8_4_ = 0x3f800000;
                auVar16._0_8_ = 0x3f8000003f800000;
                auVar16._12_4_ = 0x3f800000;
                auVar38 = vfnmadd213ps_avx512vl(local_24d8,auVar30,auVar16);
                auVar30 = vfmadd132ps_fma(auVar38,auVar30,auVar30);
                fVar49 = auVar30._0_4_;
                local_2498._0_4_ = fVar49 * local_24e8._0_4_;
                fVar54 = auVar30._4_4_;
                local_2498._4_4_ = fVar54 * local_24e8._4_4_;
                fVar55 = auVar30._8_4_;
                local_2498._8_4_ = fVar55 * local_24e8._8_4_;
                fVar56 = auVar30._12_4_;
                local_2498._12_4_ = fVar56 * local_24e8._12_4_;
                auVar52 = ZEXT1664(local_2498);
                local_24b8[0] = fVar49 * local_2508._0_4_;
                local_24b8[1] = fVar54 * local_2508._4_4_;
                local_24b8[2] = fVar55 * local_2508._8_4_;
                local_24b8[3] = fVar56 * local_2508._12_4_;
                local_24a8[0] = fVar49 * local_24f8._0_4_;
                local_24a8[1] = fVar54 * local_24f8._4_4_;
                local_24a8[2] = fVar55 * local_24f8._8_4_;
                local_24a8[3] = fVar56 * local_24f8._12_4_;
                auVar50._8_4_ = 0x7f800000;
                auVar50._0_8_ = 0x7f8000007f800000;
                auVar50._12_4_ = 0x7f800000;
                auVar30 = vblendmps_avx512vl(auVar50,local_2498);
                auVar39._0_4_ =
                     (uint)(local_24c7 & 1) * auVar30._0_4_ |
                     (uint)!(bool)(local_24c7 & 1) * 0x7f800000;
                bVar6 = (bool)(local_24c7 >> 1 & 1);
                auVar39._4_4_ = (uint)bVar6 * auVar30._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24c7 >> 2 & 1);
                auVar39._8_4_ = (uint)bVar6 * auVar30._8_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24c7 >> 3 & 1);
                auVar39._12_4_ = (uint)bVar6 * auVar30._12_4_ | (uint)!bVar6 * 0x7f800000;
                auVar30 = vshufps_avx(auVar39,auVar39,0xb1);
                auVar30 = vminps_avx(auVar30,auVar39);
                auVar38 = vshufpd_avx(auVar30,auVar30,1);
                auVar30 = vminps_avx(auVar38,auVar30);
                uVar11 = vcmpps_avx512vl(auVar39,auVar30,0);
                uVar23 = local_25ec;
                if (((byte)uVar11 & local_24c7) != 0) {
                  uVar23 = (uint)((byte)uVar11 & local_24c7);
                }
                uVar61 = 0;
                for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
                  uVar61 = uVar61 + 1;
                }
                local_2590 = local_25b0->scene;
                do {
                  local_2528 = auVar57._0_16_;
                  local_2518 = auVar52._0_16_;
                  uVar23 = uVar61 & 0xff;
                  local_2540 = *(uint *)(lVar19 + 0x90 + (ulong)uVar23 * 4);
                  local_2598 = (local_2590->geometries).items[local_2540].ptr;
                  if ((local_2598->mask & uVar60) == 0) {
                    bVar18 = ~(byte)(1 << (uVar61 & 0x1f)) & (byte)local_25ec;
                  }
                  else {
                    pRVar5 = local_25b0->args;
                    local_2458 = auVar73._0_32_;
                    local_2438 = auVar72._0_32_;
                    local_2418 = auVar71._0_32_;
                    local_23f8 = auVar70._0_32_;
                    local_23d8 = auVar68._0_32_;
                    local_23b8 = auVar67._0_32_;
                    local_2398 = auVar66._0_32_;
                    if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                      local_2588.context = local_25b0->user;
                      if (local_2598->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar21 = (ulong)(uVar23 << 2);
                        fVar49 = *(float *)((long)local_24b8 + uVar21);
                        fVar54 = *(float *)((long)local_24a8 + uVar21);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar21);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar21);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar21);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar21);
                        ray->u = fVar49;
                        ray->v = fVar54;
                        ray->primID = *(uint *)(lVar19 + 0xa0 + uVar21);
                        ray->geomID = local_2540;
                        ray->instID[0] = (local_2588.context)->instID[0];
                        ray->instPrimID[0] = (local_2588.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_2588.context = local_25b0->user;
                    }
                    uVar21 = (ulong)(uVar23 * 4);
                    local_2558 = *(float *)(local_2488 + uVar21);
                    local_2554 = *(undefined4 *)(local_2478 + uVar21);
                    local_2550 = *(undefined4 *)(local_2468 + uVar21);
                    local_254c = *(undefined4 *)((long)local_24b8 + uVar21);
                    local_2548 = *(undefined4 *)((long)local_24a8 + uVar21);
                    local_2544 = *(undefined4 *)(lVar19 + 0xa0 + uVar21);
                    local_253c = (local_2588.context)->instID[0];
                    local_2538 = (local_2588.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar21);
                    local_25c4 = -1;
                    local_2588.valid = &local_25c4;
                    local_2588.geometryUserPtr = local_2598->userPtr;
                    local_2588.ray = (RTCRayN *)ray;
                    local_2588.hit = (RTCHitN *)&local_2558;
                    local_2588.N = 1;
                    if (((local_2598->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_2598->intersectionFilterN)(&local_2588), *local_2588.valid != 0))
                       && ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_2598->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar5->filter)(&local_2588), *local_2588.valid != 0)))))) {
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2588.hit;
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2588.hit + 4);
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2588.hit + 8);
                      *(float *)((long)local_2588.ray + 0x3c) = *(float *)(local_2588.hit + 0xc);
                      *(float *)((long)local_2588.ray + 0x40) = *(float *)(local_2588.hit + 0x10);
                      *(float *)((long)local_2588.ray + 0x44) = *(float *)(local_2588.hit + 0x14);
                      *(float *)((long)local_2588.ray + 0x48) = *(float *)(local_2588.hit + 0x18);
                      *(float *)((long)local_2588.ray + 0x4c) = *(float *)(local_2588.hit + 0x1c);
                      *(float *)((long)local_2588.ray + 0x50) = *(float *)(local_2588.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_2528._0_4_;
                    }
                    auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar4._4_4_ = (ray->super_RayK<1>).mask;
                    auVar4._8_4_ = (ray->super_RayK<1>).id;
                    auVar4._12_4_ = (ray->super_RayK<1>).flags;
                    auVar57 = ZEXT1664(auVar4);
                    auVar52 = ZEXT1664(local_2518);
                    fVar49 = (ray->super_RayK<1>).tfar;
                    auVar17._4_4_ = fVar49;
                    auVar17._0_4_ = fVar49;
                    auVar17._8_4_ = fVar49;
                    auVar17._12_4_ = fVar49;
                    uVar11 = vcmpps_avx512vl(local_2518,auVar17,2);
                    bVar18 = ~(byte)(1 << (uVar61 & 0x1f)) & (byte)local_25ec & (byte)uVar11;
                    uVar60 = vextractps_avx(auVar4,1);
                    auVar66 = ZEXT3264(local_2398);
                    auVar67 = ZEXT3264(local_23b8);
                    auVar68 = ZEXT3264(local_23d8);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar69 = ZEXT3264(auVar41);
                    auVar70 = ZEXT3264(local_23f8);
                    auVar71 = ZEXT3264(local_2418);
                    auVar72 = ZEXT3264(local_2438);
                    auVar73 = ZEXT3264(local_2458);
                    auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar74 = ZEXT3264(auVar41);
                    auVar41 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar75 = ZEXT3264(auVar41);
                    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar76 = ZEXT1664(auVar30);
                    auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar77 = ZEXT3264(auVar41);
                    auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                    auVar78 = ZEXT3264(auVar41);
                  }
                  local_25ec = (uint)bVar18;
                  if (bVar18 == 0) break;
                  auVar51._8_4_ = 0x7f800000;
                  auVar51._0_8_ = 0x7f8000007f800000;
                  auVar51._12_4_ = 0x7f800000;
                  auVar30 = vblendmps_avx512vl(auVar51,auVar52._0_16_);
                  auVar40._0_4_ =
                       (uint)(bVar18 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
                  bVar6 = (bool)(bVar18 >> 1 & 1);
                  auVar40._4_4_ = (uint)bVar6 * auVar30._4_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar18 >> 2 & 1);
                  auVar40._8_4_ = (uint)bVar6 * auVar30._8_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar18 >> 3 & 1);
                  auVar40._12_4_ = (uint)bVar6 * auVar30._12_4_ | (uint)!bVar6 * 0x7f800000;
                  auVar30 = vshufps_avx(auVar40,auVar40,0xb1);
                  auVar30 = vminps_avx(auVar30,auVar40);
                  auVar38 = vshufpd_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar38,auVar30);
                  uVar11 = vcmpps_avx512vl(auVar40,auVar30,0);
                  bVar18 = (byte)uVar11 & bVar18;
                  uVar23 = local_25ec;
                  if (bVar18 != 0) {
                    uVar23 = (uint)bVar18;
                  }
                  uVar61 = 0;
                  for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
                    uVar61 = uVar61 + 1;
                  }
                } while( true );
              }
            }
            local_25a8 = local_25a8 + 1;
          } while (local_25a8 != local_25a0);
        }
        fVar49 = (ray->super_RayK<1>).tfar;
        auVar52 = ZEXT3264(CONCAT428(fVar49,CONCAT424(fVar49,CONCAT420(fVar49,CONCAT416(fVar49,
                                                  CONCAT412(fVar49,CONCAT48(fVar49,CONCAT44(fVar49,
                                                  fVar49))))))));
      }
LAB_01f17732:
    } while (local_25b8 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }